

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O0

void __thiscall
message_test_should_throw_when_missing_fields_in_repeating_group_Test::TestBody
          (message_test_should_throw_when_missing_fields_in_repeating_group_Test *this)

{
  bool bVar1;
  AssertHelper local_5620;
  Message local_5618;
  char local_5609;
  undefined1 local_5608 [8];
  Instance instance2;
  Message local_4ef8 [2];
  runtime_error *anon_var_0;
  char *pcStack_4ee0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Instance instance;
  FieldGroup<_fc5f2565_> local_47c0;
  FieldGroup<_fc5f2565_> group;
  MarketDataIncrementalRefresh refresh;
  message_test_should_throw_when_missing_fields_in_repeating_group_Test *this_local;
  
  Fixpp::VersionnedMessage<$16d94feb$>::VersionnedMessage((VersionnedMessage<_16d94feb_> *)&group);
  local_47c0 = Fixpp::createGroup<_3a11739c_>((VersionnedMessage<_16d94feb_> *)&group,1);
  Fixpp::FieldGroup<$fc5f2565$>::instance((Instance *)&gtest_msg,&local_47c0);
  Fixpp::set<_10817cd1_>((InstanceGroup<_7a79f124_> *)&gtest_msg,(char (*) [5])"TEST");
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffb120,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffb120);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Fixpp::FieldGroup<$fc5f2565$>::add(&local_47c0,(Instance *)&gtest_msg);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      Fixpp::FieldGroup<$fc5f2565$>::instance((Instance *)local_5608,&local_47c0);
      local_5609 = '0';
      Fixpp::set<_9808fe64_>((InstanceGroup<_7a79f124_> *)local_5608,&local_5609);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          Fixpp::FieldGroup<$fc5f2565$>::add(&local_47c0,(Instance *)local_5608);
        }
        anon_var_0._0_4_ = 0;
      }
      else {
        testing::Message::Message(&local_5618);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5620,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                   ,0x5f,
                   "Expected: group.add(instance2) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=(&local_5620,&local_5618);
        testing::internal::AssertHelper::~AssertHelper(&local_5620);
        testing::Message::~Message(&local_5618);
        anon_var_0._0_4_ = 1;
      }
      Fixpp::InstanceGroup<$7a79f124$>::~InstanceGroup((InstanceGroup<_7a79f124_> *)local_5608);
      goto LAB_001a224a;
    }
    pcStack_4ee0 = 
    "Expected: group.add(instance) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_4ef8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             ((long)instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10),kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
             ,0x5b,pcStack_4ee0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             ((long)instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10),local_4ef8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             ((long)instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10));
  testing::Message::~Message(local_4ef8);
  anon_var_0._0_4_ = 1;
LAB_001a224a:
  Fixpp::InstanceGroup<$7a79f124$>::~InstanceGroup((InstanceGroup<_7a79f124_> *)&gtest_msg);
  Fixpp::VersionnedMessage<$16d94feb$>::~VersionnedMessage((VersionnedMessage<_16d94feb_> *)&group);
  return;
}

Assistant:

TEST(message_test, should_throw_when_missing_fields_in_repeating_group)
{
    using namespace Fixpp;

    Fixpp::v42::Message::MarketDataIncrementalRefresh refresh;
    auto group = Fixpp::createGroup<Tag::NoMDEntries>(refresh, 1);
    auto instance = group.instance();

    Fixpp::set<Tag::MDEntryID>(instance, "TEST");
    ASSERT_THROW(group.add(instance), std::runtime_error);

    auto instance2 = group.instance();
    Fixpp::set<Tag::MDUpdateAction>(instance2, '0');
    ASSERT_NO_THROW(group.add(instance2));
}